

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryMinus<Fad<Fad<double>_>,_FadCst<int>_>::val
          (value_type *__return_storage_ptr__,FadBinaryMinus<Fad<Fad<double>_>,_FadCst<int>_> *this)

{
  FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_> local_18;
  
  local_18.fadexpr_.left_ = &this->left_->val_;
  local_18.fadexpr_.right_.defaultVal = 0;
  local_18.fadexpr_.right_.constant_ = (this->right_).constant_;
  Fad<double>::Fad<FadBinaryMinus<Fad<double>,FadCst<int>>>(__return_storage_ptr__,&local_18);
  return __return_storage_ptr__;
}

Assistant:

const value_type val() const {return left_.val() - right_.val();}